

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_7::NameApplier::UseNameForVar(NameApplier *this,string_view name,Var *var)

{
  int iVar1;
  Var *this_00;
  string_view name_00;
  string_view local_18;
  
  this_00 = (Var *)name.size_;
  local_18.size_ = (size_type)name.data_;
  if (this_00->type_ == Name) {
    local_18.data_ = (char *)this;
    iVar1 = string_view::compare(&local_18,*(string_view *)&this_00->field_2);
    if (iVar1 != 0) {
      __assert_fail("name == var->name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/apply-names.cc"
                    ,0x7a,
                    "void wabt::(anonymous namespace)::NameApplier::UseNameForVar(string_view, Var *)"
                   );
    }
  }
  else if ((char *)local_18.size_ != (char *)0x0) {
    name_00.size_ = local_18.size_;
    name_00.data_ = (char *)this;
    Var::set_name(this_00,name_00);
    return;
  }
  return;
}

Assistant:

void NameApplier::UseNameForVar(string_view name, Var* var) {
  if (var->is_name()) {
    assert(name == var->name());
    return;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
}